

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void BuildAndStoreEntropyCodesDistance
               (MemoryManager *m,BlockEncoder *self,HistogramDistance *histograms,
               size_t histograms_size,size_t alphabet_size,HuffmanTree *tree,size_t *storage_ix,
               uint8_t *storage)

{
  long lVar1;
  uint8_t *in_RCX;
  HuffmanTree *in_RDX;
  long *in_RSI;
  size_t in_RDI;
  uint16_t *in_R8;
  uint32_t *unaff_retaddr;
  size_t ix;
  size_t i;
  size_t table_size;
  size_t *in_stack_00000090;
  uint8_t *in_stack_00000098;
  size_t in_stack_ffffffffffffff98;
  MemoryManager *in_stack_ffffffffffffffa0;
  void *local_58;
  void *local_50;
  uint8_t *local_40;
  
  lVar1 = (long)in_RCX * *in_RSI;
  if (lVar1 == 0) {
    local_50 = (void *)0x0;
  }
  else {
    local_50 = duckdb_brotli::BrotliAllocate(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  in_RSI[0x75] = (long)local_50;
  if (lVar1 == 0) {
    local_58 = (void *)0x0;
  }
  else {
    local_58 = duckdb_brotli::BrotliAllocate(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  in_RSI[0x76] = (long)local_58;
  for (local_40 = (uint8_t *)0x0; local_40 < in_RCX; local_40 = local_40 + 1) {
    BuildAndStoreHuffmanTree
              (unaff_retaddr,in_RDI,(size_t)in_RSI,in_RDX,in_RCX,in_R8,in_stack_00000090,
               in_stack_00000098);
  }
  return;
}

Assistant:

static void FN(BuildAndStoreEntropyCodes)(MemoryManager* m, BlockEncoder* self,
    const HistogramType* histograms, const size_t histograms_size,
    const size_t alphabet_size, HuffmanTree* tree,
    size_t* storage_ix, uint8_t* storage) {
  const size_t table_size = histograms_size * self->histogram_length_;
  self->depths_ = BROTLI_ALLOC(m, uint8_t, table_size);
  self->bits_ = BROTLI_ALLOC(m, uint16_t, table_size);
  if (BROTLI_IS_OOM(m)) return;

  {
    size_t i;
    for (i = 0; i < histograms_size; ++i) {
      size_t ix = i * self->histogram_length_;
      BuildAndStoreHuffmanTree(&histograms[i].data_[0], self->histogram_length_,
          alphabet_size, tree, &self->depths_[ix], &self->bits_[ix],
          storage_ix, storage);
    }
  }
}